

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.h
# Opt level: O1

MessageLite * __thiscall
google::protobuf::internal::MessageCreator::PlacementNew<false,google::protobuf::MessageLite>
          (MessageCreator *this,MessageLite *prototype_for_func,MessageLite *prototype_for_copy,
          void *mem,Arena *arena)

{
  undefined4 *puVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  Tag TVar4;
  uint uVar5;
  intptr_t iVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  char *pcVar14;
  ulong uVar15;
  string *psVar16;
  string *psVar17;
  MessageLite *pMVar18;
  MessageLite *pMVar19;
  MessageLite *pMVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  undefined1 *puVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  MessageLite MStack_60;
  Arena *pAStack_50;
  undefined1 local_40 [16];
  
  psVar17 = (string *)0x0;
  uVar21 = (ulong)mem % (ulong)this->alignment_;
  if (uVar21 != 0) {
    pAStack_50 = (Arena *)0x15f17c;
    psVar17 = absl::lts_20240722::log_internal::MakeCheckOpString<unsigned_long,long>
                        (uVar21,0,"reinterpret_cast<uintptr_t>(mem) % alignment_ == 0u");
  }
  if (psVar17 == (string *)0x0) {
    TVar4 = this->tag_;
    if ((long)TVar4 < 0) {
      pMVar18 = (MessageLite *)(*(this->field_3).func_)(prototype_for_func,mem,arena);
      return pMVar18;
    }
    uVar5 = this->allocation_size_;
    uVar21 = (ulong)uVar5;
    if (TVar4 == kZeroInit) {
      pAStack_50 = (Arena *)0x15ef84;
      pcVar14 = std::
                __find_if<char_const*,__gnu_cxx::__ops::_Iter_negate<google::protobuf::internal::MessageCreator::PlacementNew<false,google::protobuf::MessageLite>(google::protobuf::MessageLite_const*,google::protobuf::MessageLite_const*,void*,google::protobuf::Arena*)const::_lambda(auto:1)_1_>>
                          (prototype_for_copy + 1);
      if (pcVar14 == (char *)((long)&prototype_for_copy->_vptr_MessageLite + uVar21)) {
        if (uVar5 < 0x21) {
          uVar25 = 0;
          uVar26 = 0;
          uVar27 = 0;
          uVar28 = 0;
          goto LAB_0015efbc;
        }
        if (uVar5 < 0x41) {
          uVar25 = 0;
          uVar26 = 0;
          uVar27 = 0;
          uVar28 = 0;
          *(undefined8 *)((long)mem + 0x10) = 0;
          *(undefined8 *)((long)mem + 0x18) = 0;
          puVar3 = (undefined8 *)((long)mem + (uVar21 - 0x10));
          *puVar3 = 0;
          puVar3[1] = 0;
          goto LAB_0015f003;
        }
        if (0x50 < uVar5) {
          lVar22 = (long)mem + 0x50;
          uVar15 = 0x50;
          do {
            *(undefined8 *)(lVar22 + -0x10) = 0;
            *(undefined8 *)(lVar22 + -8) = 0;
            *(undefined8 *)(lVar22 + -0x20) = 0;
            *(undefined8 *)(lVar22 + -0x18) = 0;
            *(undefined8 *)(lVar22 + -0x30) = 0;
            *(undefined8 *)(lVar22 + -0x28) = 0;
            *(undefined8 *)(lVar22 + -0x40) = 0;
            *(undefined8 *)(lVar22 + -0x38) = 0;
            uVar15 = uVar15 + 0x40;
            lVar22 = lVar22 + 0x40;
          } while (uVar15 < uVar21);
        }
        uVar25 = 0;
        uVar26 = 0;
        uVar27 = 0;
        uVar28 = 0;
        puVar3 = (undefined8 *)((long)mem + (uVar21 - 0x10));
        *puVar3 = 0;
        puVar3[1] = 0;
        puVar3 = (undefined8 *)((long)mem + (uVar21 - 0x20));
        *puVar3 = 0;
        puVar3[1] = 0;
        puVar3 = (undefined8 *)((long)mem + (uVar21 - 0x30));
        *puVar3 = 0;
        puVar3[1] = 0;
LAB_0015f0cd:
        puVar1 = (undefined4 *)((long)mem + (uVar21 - 0x40));
        *puVar1 = uVar25;
        puVar1[1] = uVar26;
        puVar1[2] = uVar27;
        puVar1[3] = uVar28;
        goto LAB_0015f0d3;
      }
      pAStack_50 = (Arena *)0x15f1c1;
      PlacementNew<false,google::protobuf::MessageLite>();
LAB_0015f1c1:
      pAStack_50 = (Arena *)0x15f1ce;
      PlacementNew<false,google::protobuf::MessageLite>();
    }
    else {
      if (TVar4 == kMemcpy) {
        psVar16 = (string *)0x0;
      }
      else {
        pAStack_50 = (Arena *)0x15f1b2;
        psVar16 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                            ((long)TVar4,1,"+as_tag == +kMemcpy");
      }
      if (psVar16 != (string *)0x0) goto LAB_0015f1e5;
      if (uVar5 < 0x21) {
        puVar1 = (undefined4 *)((long)&prototype_for_copy[-1]._vptr_MessageLite + uVar21);
        uVar25 = *puVar1;
        uVar26 = puVar1[1];
        uVar27 = puVar1[2];
        uVar28 = puVar1[3];
LAB_0015efbc:
        puVar1 = (undefined4 *)((long)mem + (uVar21 - 0x10));
        *puVar1 = uVar25;
        puVar1[1] = uVar26;
        puVar1[2] = uVar27;
        puVar1[3] = uVar28;
      }
      else {
        if (0x40 < uVar5) {
          if (0x50 < uVar5) {
            lVar22 = (long)mem + 0x50;
            uVar15 = 0x50;
            do {
              puVar3 = (undefined8 *)((long)&prototype_for_copy[-4]._vptr_MessageLite + uVar15);
              uVar7 = *puVar3;
              uVar8 = puVar3[1];
              puVar3 = (undefined8 *)((long)&prototype_for_copy[-3]._vptr_MessageLite + uVar15);
              uVar9 = *puVar3;
              uVar10 = puVar3[1];
              puVar3 = (undefined8 *)((long)&prototype_for_copy[-2]._vptr_MessageLite + uVar15);
              uVar11 = *puVar3;
              uVar12 = puVar3[1];
              puVar3 = (undefined8 *)((long)&prototype_for_copy[-1]._vptr_MessageLite + uVar15);
              uVar13 = puVar3[1];
              *(undefined8 *)(lVar22 + -0x10) = *puVar3;
              *(undefined8 *)(lVar22 + -8) = uVar13;
              *(undefined8 *)(lVar22 + -0x20) = uVar11;
              *(undefined8 *)(lVar22 + -0x18) = uVar12;
              *(undefined8 *)(lVar22 + -0x30) = uVar9;
              *(undefined8 *)(lVar22 + -0x28) = uVar10;
              *(undefined8 *)(lVar22 + -0x40) = uVar7;
              *(undefined8 *)(lVar22 + -0x38) = uVar8;
              uVar15 = uVar15 + 0x40;
              lVar22 = lVar22 + 0x40;
            } while (uVar15 < uVar21);
          }
          puVar1 = (undefined4 *)((long)&prototype_for_copy[-4]._vptr_MessageLite + uVar21);
          uVar25 = *puVar1;
          uVar26 = puVar1[1];
          uVar27 = puVar1[2];
          uVar28 = puVar1[3];
          puVar3 = (undefined8 *)((long)&prototype_for_copy[-3]._vptr_MessageLite + uVar21);
          uVar7 = *puVar3;
          uVar8 = puVar3[1];
          puVar3 = (undefined8 *)((long)&prototype_for_copy[-2]._vptr_MessageLite + uVar21);
          uVar9 = *puVar3;
          uVar10 = puVar3[1];
          puVar3 = (undefined8 *)((long)&prototype_for_copy[-1]._vptr_MessageLite + uVar21);
          uVar11 = puVar3[1];
          puVar2 = (undefined8 *)((long)mem + (uVar21 - 0x10));
          *puVar2 = *puVar3;
          puVar2[1] = uVar11;
          puVar3 = (undefined8 *)((long)mem + (uVar21 - 0x20));
          *puVar3 = uVar9;
          puVar3[1] = uVar10;
          puVar3 = (undefined8 *)((long)mem + (uVar21 - 0x30));
          *puVar3 = uVar7;
          puVar3[1] = uVar8;
          goto LAB_0015f0cd;
        }
        iVar6 = prototype_for_copy[1]._internal_metadata_.ptr_;
        *(_func_int ***)((long)mem + 0x10) = prototype_for_copy[1]._vptr_MessageLite;
        *(intptr_t *)((long)mem + 0x18) = iVar6;
        puVar1 = (undefined4 *)((long)&prototype_for_copy[-2]._vptr_MessageLite + uVar21);
        uVar25 = *puVar1;
        uVar26 = puVar1[1];
        uVar27 = puVar1[2];
        uVar28 = puVar1[3];
        puVar3 = (undefined8 *)((long)&prototype_for_copy[-1]._vptr_MessageLite + uVar21);
        uVar7 = puVar3[1];
        puVar2 = (undefined8 *)((long)mem + (uVar21 - 0x10));
        *puVar2 = *puVar3;
        puVar2[1] = uVar7;
LAB_0015f003:
        puVar1 = (undefined4 *)((long)mem + (uVar21 - 0x20));
        *puVar1 = uVar25;
        puVar1[1] = uVar26;
        puVar1[2] = uVar27;
        puVar1[3] = uVar28;
      }
LAB_0015f0d3:
      pAStack_50 = (Arena *)0x15f0db;
      arena_bits(this);
      pAStack_50 = (Arena *)0x15f0e3;
      uVar15 = arena_bits(this);
      while( true ) {
        if (uVar15 == 0) {
          iVar6 = (prototype_for_copy->_internal_metadata_).ptr_;
          *(_func_int ***)mem = prototype_for_copy->_vptr_MessageLite;
          *(intptr_t *)((long)mem + 8) = iVar6;
          *(Arena **)((long)mem + 8) = arena;
          return (MessageLite *)mem;
        }
        lVar22 = 0;
        if (uVar15 != 0) {
          for (; (uVar15 >> lVar22 & 1) == 0; lVar22 = lVar22 + 1) {
          }
        }
        uVar23 = (ulong)(uint)((int)lVar22 << 3);
        if (uVar21 < uVar23 + 8) {
          pAStack_50 = (Arena *)0x15f138;
          psVar16 = absl::lts_20240722::log_internal::MakeCheckOpString<unsigned_long,unsigned_long>
                              (uVar23 + 8,uVar21,"offset + sizeof(Arena*) <= size");
        }
        else {
          psVar16 = (string *)0x0;
        }
        if (psVar16 != (string *)0x0) break;
        if (*(void **)((long)mem + uVar23) == (void *)0x0) {
          psVar16 = (string *)0x0;
        }
        else {
          pAStack_50 = (Arena *)0x15f148;
          psVar16 = absl::lts_20240722::log_internal::MakeCheckOpString<void_const*,void_const*>
                              (*(void **)((long)mem + uVar23),(void *)0x0,
                               "*reinterpret_cast<Arena**>(dst + offset) == nullptr");
        }
        if (psVar16 != (string *)0x0) goto LAB_0015f1c1;
        *(Arena **)((long)mem + uVar23) = arena;
        uVar15 = uVar15 & uVar15 - 1;
      }
    }
    pAStack_50 = (Arena *)0x15f1db;
    PlacementNew<false,google::protobuf::MessageLite>();
  }
  pAStack_50 = (Arena *)0x15f1e5;
  PlacementNew<false,google::protobuf::MessageLite>();
LAB_0015f1e5:
  puVar24 = local_40;
  pAStack_50 = (Arena *)arena_bits;
  PlacementNew<false,google::protobuf::MessageLite>();
  pMVar18 = &MStack_60;
  pAStack_50 = arena;
  if (puVar24[4] == -1) {
    pMVar19 = (MessageLite *)
              absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                        (-1,-1,"+tag() != +kFunc");
  }
  else {
    pMVar19 = (MessageLite *)0x0;
  }
  if (pMVar19 == (MessageLite *)0x0) {
    return *(MessageLite **)(puVar24 + 8);
  }
  arena_bits();
  lVar22 = (long)pMVar19 - (long)pMVar18 >> 2;
  pMVar20 = pMVar18;
  if (0 < lVar22) {
    pMVar20 = (MessageLite *)
              ((long)&pMVar18->_vptr_MessageLite +
              ((long)pMVar19 - (long)pMVar18 & 0xfffffffffffffffcU));
    lVar22 = lVar22 + 1;
    pMVar18 = (MessageLite *)((long)&pMVar18->_vptr_MessageLite + 3);
    do {
      if (*(char *)((long)&pMVar18[-1]._internal_metadata_.ptr_ + 5) != '\0') {
        return (MessageLite *)((long)&pMVar18[-1]._internal_metadata_.ptr_ + 5);
      }
      if (*(char *)((long)&pMVar18[-1]._internal_metadata_.ptr_ + 6) != '\0') {
        return (MessageLite *)((long)&pMVar18[-1]._internal_metadata_.ptr_ + 6);
      }
      if (*(char *)((long)&pMVar18[-1]._internal_metadata_.ptr_ + 7) != '\0') {
        return (MessageLite *)((long)&pMVar18[-1]._internal_metadata_.ptr_ + 7);
      }
      if (*(char *)&pMVar18->_vptr_MessageLite != '\0') {
        return pMVar18;
      }
      lVar22 = lVar22 + -1;
      pMVar18 = (MessageLite *)((long)&pMVar18->_vptr_MessageLite + 4);
    } while (1 < lVar22);
  }
  lVar22 = (long)pMVar19 - (long)pMVar20;
  if (lVar22 != 1) {
    if (lVar22 != 2) {
      if (lVar22 != 3) {
        return pMVar19;
      }
      if (*(char *)&pMVar20->_vptr_MessageLite != '\0') {
        return pMVar20;
      }
      pMVar20 = (MessageLite *)((long)&pMVar20->_vptr_MessageLite + 1);
    }
    if (*(char *)&pMVar20->_vptr_MessageLite != '\0') {
      return pMVar20;
    }
    pMVar20 = (MessageLite *)((long)&pMVar20->_vptr_MessageLite + 1);
  }
  if (*(char *)&pMVar20->_vptr_MessageLite != '\0') {
    return pMVar20;
  }
  return pMVar19;
}

Assistant:

PROTOBUF_ALWAYS_INLINE inline MessageLite* MessageCreator::PlacementNew(
    const MessageLite* prototype_for_func,
    const MessageLite* prototype_for_copy, void* mem, Arena* arena) const {
  ABSL_DCHECK_EQ(reinterpret_cast<uintptr_t>(mem) % alignment_, 0u);
  const Tag as_tag = tag();
  // When the feature is not enabled we skip the `as_tag` check since it is
  // unnecessary. Except for testing, where we want to test the copy logic even
  // when we can't use it for real messages.
  constexpr bool kMustBeFunc = !test_call && !internal::EnableCustomNew();
  static_assert(kFunc < 0 && !(kZeroInit < 0) && !(kMemcpy < 0),
                "Only kFunc must be the only negative value");
  if (ABSL_PREDICT_FALSE(kMustBeFunc || as_tag < 0)) {
    PROTOBUF_DEBUG_COUNTER("MessageCreator.Func").Inc();
    return static_cast<MessageLite*>(func_(prototype_for_func, mem, arena));
  }

  char* dst = static_cast<char*>(mem);
  const size_t size = allocation_size_;
  const char* src = reinterpret_cast<const char*>(prototype_for_copy);

  // These are a bit more efficient than calling normal memset/memcpy because:
  //  - We know the minimum size is 16. We have a fallback for when it is not.
  //  - We can "underflow" the buffer because those are the MessageLite bytes
  //    we will set later.
#ifndef PROTO2_OPENSOURCE
  // This manual handling shows a 1.85% improvement in the parsing
  // microbenchmark.
  // TODO: Verify this is still the case.
#endif  // !PROTO2_OPENSOUCE
  if (as_tag == kZeroInit) {
    // Make sure the input is really all zeros.
    ABSL_DCHECK(std::all_of(src + sizeof(MessageLite), src + size,
                            [](auto c) { return c == 0; }));

    if (sizeof(MessageLite) != 16) {
      memset(dst, 0, size);
    } else if (size <= 32) {
      memset(dst + size - 16, 0, 16);
    } else if (size <= 64) {
      memset(dst + 16, 0, 16);
      memset(dst + size - 32, 0, 32);
    } else {
      for (size_t offset = 16; offset + 64 < size; offset += 64) {
        absl::PrefetchToLocalCacheForWrite(dst + offset + 64);
        memset(dst + offset, 0, 64);
      }
      memset(dst + size - 64, 0, 64);
    }
  } else {
    ABSL_DCHECK_EQ(+as_tag, +kMemcpy);

    if (sizeof(MessageLite) != 16) {
      memcpy(dst, src, size);
    } else if (size <= 32) {
      memcpy(dst + size - 16, src + size - 16, 16);
    } else if (size <= 64) {
      memcpy(dst + 16, src + 16, 16);
      memcpy(dst + size - 32, src + size - 32, 32);
    } else {
      for (size_t offset = 16; offset + 64 < size; offset += 64) {
        absl::PrefetchToLocalCache(src + offset + 64);
        absl::PrefetchToLocalCacheForWrite(dst + offset + 64);
        memcpy(dst + offset, src + offset, 64);
      }
      memcpy(dst + size - 64, src + size - 64, 64);
    }
  }

  if (arena_bits() != 0) {
    if (as_tag == kZeroInit) {
      PROTOBUF_DEBUG_COUNTER("MessageCreator.ZeroArena").Inc();
    } else {
      PROTOBUF_DEBUG_COUNTER("MessageCreator.McpyArena").Inc();
    }
  } else {
    if (as_tag == kZeroInit) {
      PROTOBUF_DEBUG_COUNTER("MessageCreator.Zero").Inc();
    } else {
      PROTOBUF_DEBUG_COUNTER("MessageCreator.Mcpy").Inc();
    }
  }

  if (internal::PerformDebugChecks() || arena != nullptr) {
    if (uintptr_t offsets = arena_bits()) {
      do {
        const size_t offset = absl::countr_zero(offsets) * sizeof(Arena*);
        ABSL_DCHECK_LE(offset + sizeof(Arena*), size);
        // Verify we are overwriting a null pointer. If we are not, there is a
        // bug somewhere.
        ABSL_DCHECK_EQ(*reinterpret_cast<Arena**>(dst + offset), nullptr);
        memcpy(dst + offset, &arena, sizeof(arena));
        offsets &= offsets - 1;
      } while (offsets != 0);
    }
  }

  // The second memcpy overwrites part of the first, but the compiler should
  // avoid the double-write. It's easier than trying to avoid the overlap.
  memcpy(dst, static_cast<const void*>(prototype_for_copy),
         sizeof(MessageLite));
  memcpy(dst + PROTOBUF_FIELD_OFFSET(MessageLite, _internal_metadata_), &arena,
         sizeof(arena));
  return Launder(reinterpret_cast<MessageLite*>(mem));
}